

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O3

RefCntWeakPtr<Diligent::ISampler> * __thiscall
Diligent::RefCntWeakPtr<Diligent::ISampler>::operator=
          (RefCntWeakPtr<Diligent::ISampler> *this,RefCntAutoPtr<Diligent::ISampler> *AutoPtr)

{
  ISampler *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  RefCountersImpl *pSrcPtr;
  
  Release(this);
  pIVar1 = AutoPtr->m_pObject;
  this->m_pObject = pIVar1;
  if (pIVar1 != (ISampler *)0x0) {
    iVar2 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[3])();
    pSrcPtr = (RefCountersImpl *)CONCAT44(extraout_var,iVar2);
    if (pSrcPtr != (RefCountersImpl *)0x0) {
      CheckDynamicType<Diligent::RefCountersImpl,Diligent::IReferenceCounters>
                ((IReferenceCounters *)pSrcPtr);
      this->m_pRefCounters = pSrcPtr;
      LOCK();
      (pSrcPtr->m_NumWeakReferences).super___atomic_base<int>._M_i =
           (pSrcPtr->m_NumWeakReferences).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      return this;
    }
  }
  this->m_pRefCounters = (RefCountersImpl *)0x0;
  return this;
}

Assistant:

RefCntWeakPtr& operator=(RefCntAutoPtr<T>& AutoPtr) noexcept
    {
        Release();
        m_pObject      = static_cast<T*>(AutoPtr);
        m_pRefCounters = m_pObject ? ClassPtrCast<RefCountersImpl>(m_pObject->GetReferenceCounters()) : nullptr;
        if (m_pRefCounters)
            m_pRefCounters->AddWeakRef();
        return *this;
    }